

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::Remove(SQTable *this,SQObjectPtr *key)

{
  SQHash SVar1;
  _HashNode *p_Var2;
  SQObject *in_RSI;
  SQTable *in_RDI;
  _HashNode *n;
  
  SVar1 = HashObj(in_RSI);
  p_Var2 = _Get(in_RDI,(SQObjectPtr *)in_RSI,SVar1 & in_RDI->_numofnodes - 1U);
  if (p_Var2 != (_HashNode *)0x0) {
    ::SQObjectPtr::Null((SQObjectPtr *)in_RSI);
    ::SQObjectPtr::Null((SQObjectPtr *)in_RSI);
    in_RDI->_usednodes = in_RDI->_usednodes + -1;
    Rehash(this,key._7_1_);
  }
  return;
}

Assistant:

void SQTable::Remove(const SQObjectPtr &key)
{

    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        n->val.Null();
        n->key.Null();
        _usednodes--;
        Rehash(false);
    }
}